

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O3

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageTimeOperator::process
          (MessageTimeOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined8 *in_RDX;
  
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl == (Message *)0x0) {
    pp_Var2 = (_func_int **)*in_RDX;
  }
  else {
    p_Var1 = (_func_int *)
             (*(code *)message[4]._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)(message + 1);
    pp_Var2 = (_func_int **)*in_RDX;
    *pp_Var2 = p_Var1;
  }
  (this->super_FilterOperator)._vptr_FilterOperator = pp_Var2;
  *in_RDX = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageTimeOperator::process(std::unique_ptr<Message> message)
{
    if (TimeFunction) {
        message->time = TimeFunction(message->time);
    }
    return message;
}